

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tfad.h
# Opt level: O2

TFad<6,_double> * __thiscall
TFad<6,double>::operator=
          (TFad<6,double> *this,
          TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>
          *fadexpr)

{
  int i;
  long lVar1;
  value_type vVar2;
  
  for (lVar1 = 0; lVar1 != 6; lVar1 = lVar1 + 1) {
    vVar2 = TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>
            ::dx(&fadexpr->fadexpr_,(int)lVar1);
    *(value_type *)(this + lVar1 * 8 + 0x10) = vVar2;
  }
  vVar2 = TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>
          ::val(&fadexpr->fadexpr_);
  *(value_type *)(this + 8) = vVar2;
  return (TFad<6,_double> *)this;
}

Assistant:

inline TFad<Num,T> & TFad<Num,T>::operator=(const TFadExpr<ExprT>& fadexpr) 
{
  for(int i=0; i<Num; ++i)
    dx_[i] = fadexpr.dx(i);
  
  val_ = fadexpr.val();
  
  return *this;
}